

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOptimizationTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Performance::ShaderOptimizationTests::init
          (ShaderOptimizationTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  uint uVar2;
  TestNode *node;
  TestNode *pTVar3;
  TestNode *node_00;
  undefined8 *puVar4;
  long *plVar5;
  ShaderOptimizationCase *pSVar6;
  long *plVar7;
  ulong *puVar8;
  char *pcVar9;
  int iVar10;
  long lVar11;
  ShaderOptimizationTests *pSVar12;
  char *pcVar13;
  ulong uVar14;
  int iVar15;
  bool bVar16;
  string caseTypeDesc;
  string caseTypeName;
  string description;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ostringstream s;
  ulong *local_2b8;
  long local_2b0;
  ulong local_2a8;
  long lStack_2a0;
  long *local_298;
  long local_290;
  long local_288;
  long lStack_280;
  ulong local_278;
  long *local_270;
  long local_268;
  long local_260;
  long lStack_258;
  ShaderOptimizationTests *local_250;
  char *local_248;
  long *local_240;
  long local_238;
  long local_230;
  long lStack_228;
  ulong *local_220;
  long local_218;
  ulong local_210;
  long lStack_208;
  ulong *local_200;
  long local_1f8;
  ulong local_1f0 [2];
  TestNode *local_1e0;
  TestNode *local_1d8;
  TestNode *local_1d0;
  TestNode *local_1c8;
  TestNode *local_1c0;
  char *local_1b8;
  TestNode *local_1b0;
  long *local_1a8;
  long local_1a0;
  long local_198;
  long lStack_190;
  ios_base local_138 [264];
  
  node = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,pCVar1->m_testCtx,"loop_unrolling","Loop Unrolling Cases");
  node->_vptr_TestNode = (_func_int **)&PTR__TestCase_0217f168;
  node[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar3 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,pCVar1->m_testCtx,"loop_invariant_code_motion",
             "Loop-Invariant Code Motion Cases");
  ((TestNode *)&pTVar3->_vptr_TestNode)->_vptr_TestNode = (_func_int **)&PTR__TestCase_0217f168;
  ((TestNode *)&pTVar3[1]._vptr_TestNode)->_vptr_TestNode = (_func_int **)pCVar1;
  local_1d8 = pTVar3;
  pTVar3 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,pCVar1->m_testCtx,"function_inlining","Function Inlining Cases"
            );
  ((TestNode *)&pTVar3->_vptr_TestNode)->_vptr_TestNode = (_func_int **)&PTR__TestCase_0217f168;
  ((TestNode *)&pTVar3[1]._vptr_TestNode)->_vptr_TestNode = (_func_int **)pCVar1;
  local_1e0 = pTVar3;
  pTVar3 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,pCVar1->m_testCtx,"constant_propagation",
             "Constant Propagation Cases");
  ((TestNode *)&pTVar3->_vptr_TestNode)->_vptr_TestNode = (_func_int **)&PTR__TestCase_0217f168;
  ((TestNode *)&pTVar3[1]._vptr_TestNode)->_vptr_TestNode = (_func_int **)pCVar1;
  local_1d0 = pTVar3;
  pTVar3 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,pCVar1->m_testCtx,"common_subexpression_elimination",
             "Common Subexpression Elimination Cases");
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_0217f168;
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar1;
  node_00 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_00,pCVar1->m_testCtx,"dead_code_elimination",
             "Dead Code Elimination Cases");
  node_00->_vptr_TestNode = (_func_int **)&PTR__TestCase_0217f168;
  node_00[1]._vptr_TestNode = (_func_int **)pCVar1;
  local_1b0 = node;
  tcu::TestNode::addChild((TestNode *)this,node);
  tcu::TestNode::addChild((TestNode *)this,local_1d8);
  tcu::TestNode::addChild((TestNode *)this,local_1e0);
  tcu::TestNode::addChild((TestNode *)this,local_1d0);
  local_1c0 = pTVar3;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  local_1c8 = node_00;
  tcu::TestNode::addChild((TestNode *)this,node_00);
  local_278 = 0;
  local_250 = this;
  do {
    local_248 = "_fragment";
    if ((int)local_278 == 0) {
      local_248 = "_vertex";
    }
    iVar10 = 0;
    do {
      pcVar13 = "dependent_iterations";
      if (iVar10 == 0) {
        pcVar13 = "independent_iterations";
      }
      local_298 = &local_288;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_298,pcVar13,pcVar13 + (ulong)(iVar10 == 0) * 2 + 0x14);
      pcVar13 = "loop iterations depend on each other";
      if (iVar10 == 0) {
        pcVar13 = "loop iterations don\'t depend on each other";
      }
      local_2b8 = &local_2a8;
      pcVar9 = pcVar13 + 0x24;
      if (iVar10 == 0) {
        pcVar9 = pcVar13 + 0x2a;
      }
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,pcVar13,pcVar9);
      lVar11 = 0;
      do {
        iVar15 = *(int *)((long)init()::callNestingDepths + lVar11);
        local_220 = &local_210;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_220,local_298,(long)local_298 + local_290);
        std::__cxx11::string::append((char *)&local_220);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::ostream::operator<<((ostringstream *)&local_1a8,iVar15);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        uVar14 = 0xf;
        if (local_220 != &local_210) {
          uVar14 = local_210;
        }
        if (uVar14 < (ulong)(local_1f8 + local_218)) {
          uVar14 = 0xf;
          if (local_200 != local_1f0) {
            uVar14 = local_1f0[0];
          }
          if (uVar14 < (ulong)(local_1f8 + local_218)) goto LAB_012f54bf;
          puVar4 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_200,0,(char *)0x0,(ulong)local_220);
        }
        else {
LAB_012f54bf:
          puVar4 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_220,(ulong)local_200);
        }
        local_270 = &local_260;
        plVar5 = puVar4 + 2;
        if ((long *)*puVar4 == plVar5) {
          local_260 = *plVar5;
          lStack_258 = puVar4[3];
        }
        else {
          local_260 = *plVar5;
          local_270 = (long *)*puVar4;
        }
        local_268 = puVar4[1];
        *puVar4 = plVar5;
        puVar4[1] = 0;
        *(undefined1 *)plVar5 = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_270);
        local_240 = &local_230;
        plVar7 = plVar5 + 2;
        if ((long *)*plVar5 == plVar7) {
          local_230 = *plVar7;
          lStack_228 = plVar5[3];
        }
        else {
          local_230 = *plVar7;
          local_240 = (long *)*plVar5;
        }
        local_238 = plVar5[1];
        *plVar5 = (long)plVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        if (local_270 != &local_260) {
          operator_delete(local_270,local_260 + 1);
        }
        if (local_200 != local_1f0) {
          operator_delete(local_200,local_1f0[0] + 1);
        }
        if (local_220 != &local_210) {
          operator_delete(local_220,local_210 + 1);
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::ostream::operator<<((ostringstream *)&local_1a8,iVar15);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_200);
        puVar8 = (ulong *)(plVar5 + 2);
        if ((ulong *)*plVar5 == puVar8) {
          local_210 = *puVar8;
          lStack_208 = plVar5[3];
          local_220 = &local_210;
        }
        else {
          local_210 = *puVar8;
          local_220 = (ulong *)*plVar5;
        }
        local_218 = plVar5[1];
        *plVar5 = (long)puVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_220,(ulong)local_2b8);
        local_270 = &local_260;
        plVar7 = plVar5 + 2;
        if ((long *)*plVar5 == plVar7) {
          local_260 = *plVar7;
          lStack_258 = plVar5[3];
        }
        else {
          local_260 = *plVar7;
          local_270 = (long *)*plVar5;
        }
        local_268 = plVar5[1];
        *plVar5 = (long)plVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        if (local_220 != &local_210) {
          operator_delete(local_220,local_210 + 1);
        }
        if (local_200 != local_1f0) {
          operator_delete(local_200,local_1f0[0] + 1);
        }
        pSVar6 = (ShaderOptimizationCase *)operator_new(0x358);
        anon_unknown_1::ShaderOptimizationCase::ShaderOptimizationCase
                  (pSVar6,(local_250->super_TestCaseGroup).m_context,(char *)local_240,
                   (char *)local_270,(CaseShaderType)local_278);
        (pSVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__ShaderOptimizationCase_0219cca8;
        *(int *)&pSVar6[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = iVar15;
        *(int *)((long)&pSVar6[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) =
             iVar10;
        tcu::TestNode::addChild(local_1b0,(TestNode *)pSVar6);
        if (local_270 != &local_260) {
          operator_delete(local_270,local_260 + 1);
        }
        if (local_240 != &local_230) {
          operator_delete(local_240,local_230 + 1);
        }
        pSVar12 = local_250;
        lVar11 = lVar11 + 4;
      } while (lVar11 != 0xc);
      if (local_2b8 != &local_2a8) {
        operator_delete(local_2b8,local_2a8 + 1);
      }
      if (local_298 != &local_288) {
        operator_delete(local_298,local_288 + 1);
      }
      bVar16 = iVar10 == 0;
      iVar10 = iVar10 + 1;
    } while (bVar16);
    lVar11 = 0;
    do {
      iVar10 = *(int *)((long)init()::callNestingDepths + lVar11);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::ostream::operator<<((ostringstream *)&local_1a8,iVar10);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::ios_base::~ios_base(local_138);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_240);
      local_2b8 = &local_2a8;
      puVar8 = (ulong *)(plVar5 + 2);
      if ((ulong *)*plVar5 == puVar8) {
        local_2a8 = *puVar8;
        lStack_2a0 = plVar5[3];
      }
      else {
        local_2a8 = *puVar8;
        local_2b8 = (ulong *)*plVar5;
      }
      local_2b0 = plVar5[1];
      *plVar5 = (long)puVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_2b8);
      local_298 = &local_288;
      plVar7 = plVar5 + 2;
      if ((long *)*plVar5 == plVar7) {
        local_288 = *plVar7;
        lStack_280 = plVar5[3];
      }
      else {
        local_288 = *plVar7;
        local_298 = (long *)*plVar5;
      }
      local_290 = plVar5[1];
      *plVar5 = (long)plVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if (local_2b8 != &local_2a8) {
        operator_delete(local_2b8,local_2a8 + 1);
      }
      if (local_240 != &local_230) {
        operator_delete(local_240,local_230 + 1);
      }
      pSVar6 = (ShaderOptimizationCase *)operator_new(0x358);
      anon_unknown_1::ShaderOptimizationCase::ShaderOptimizationCase
                (pSVar6,(pSVar12->super_TestCaseGroup).m_context,(char *)local_298,
                 glcts::fixed_sample_locations_values + 1,(CaseShaderType)local_278);
      (pSVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ShaderOptimizationCase_0219cd58;
      *(int *)&pSVar6[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = iVar10;
      tcu::TestNode::addChild(local_1d8,(TestNode *)pSVar6);
      if (local_298 != &local_288) {
        operator_delete(local_298,local_288 + 1);
      }
      lVar11 = lVar11 + 4;
    } while (lVar11 != 0xc);
    lVar11 = 0;
    do {
      iVar10 = *(int *)((long)init()::callNestingDepths + lVar11);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::ostream::operator<<((ostringstream *)&local_1a8,iVar10);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::ios_base::~ios_base(local_138);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_240);
      local_2b8 = &local_2a8;
      puVar8 = (ulong *)(plVar5 + 2);
      if ((ulong *)*plVar5 == puVar8) {
        local_2a8 = *puVar8;
        lStack_2a0 = plVar5[3];
      }
      else {
        local_2a8 = *puVar8;
        local_2b8 = (ulong *)*plVar5;
      }
      local_2b0 = plVar5[1];
      *plVar5 = (long)puVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_2b8);
      local_298 = &local_288;
      plVar7 = plVar5 + 2;
      if ((long *)*plVar5 == plVar7) {
        local_288 = *plVar7;
        lStack_280 = plVar5[3];
      }
      else {
        local_288 = *plVar7;
        local_298 = (long *)*plVar5;
      }
      local_290 = plVar5[1];
      *plVar5 = (long)plVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if (local_2b8 != &local_2a8) {
        operator_delete(local_2b8,local_2a8 + 1);
      }
      if (local_240 != &local_230) {
        operator_delete(local_240,local_230 + 1);
      }
      pSVar6 = (ShaderOptimizationCase *)operator_new(0x358);
      anon_unknown_1::ShaderOptimizationCase::ShaderOptimizationCase
                (pSVar6,(pSVar12->super_TestCaseGroup).m_context,(char *)local_298,
                 glcts::fixed_sample_locations_values + 1,(CaseShaderType)local_278);
      (pSVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ShaderOptimizationCase_0219cdb0;
      *(int *)&pSVar6[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = iVar10;
      tcu::TestNode::addChild(local_1e0,(TestNode *)pSVar6);
      if (local_298 != &local_288) {
        operator_delete(local_298,local_288 + 1);
      }
      lVar11 = lVar11 + 4;
    } while (lVar11 != 0xc);
    iVar10 = 0;
    do {
      pcVar13 = "built_in_functions";
      if (iVar10 != 0) {
        if (iVar10 == 1) {
          pcVar13 = "array";
        }
        else {
          pcVar13 = (char *)0x0;
          if (iVar10 == 2) {
            pcVar13 = "struct";
          }
        }
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a8,pcVar13,(allocator<char> *)&local_298);
      iVar15 = 0;
      do {
        local_2b8 = &local_2a8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2b8,local_1a8,(long)local_1a8 + local_1a0);
        std::__cxx11::string::append((char *)&local_2b8);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_2b8);
        local_298 = &local_288;
        plVar7 = plVar5 + 2;
        if ((long *)*plVar5 == plVar7) {
          local_288 = *plVar7;
          lStack_280 = plVar5[3];
        }
        else {
          local_288 = *plVar7;
          local_298 = (long *)*plVar5;
        }
        local_290 = plVar5[1];
        *plVar5 = (long)plVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        if (local_2b8 != &local_2a8) {
          operator_delete(local_2b8,local_2a8 + 1);
        }
        pSVar6 = (ShaderOptimizationCase *)operator_new(0x358);
        anon_unknown_1::ShaderOptimizationCase::ShaderOptimizationCase
                  (pSVar6,(local_250->super_TestCaseGroup).m_context,(char *)local_298,
                   glcts::fixed_sample_locations_values + 1,(CaseShaderType)local_278);
        (pSVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__ShaderOptimizationCase_0219ce08;
        *(int *)&pSVar6[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = iVar10;
        *(char *)((long)&pSVar6[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4)
             = (char)iVar15;
        tcu::TestNode::addChild(local_1d0,(TestNode *)pSVar6);
        if (local_298 != &local_288) {
          operator_delete(local_298,local_288 + 1);
        }
        iVar15 = iVar15 + 1;
      } while (iVar15 == 1);
      if (local_1a8 != &local_198) {
        operator_delete(local_1a8,local_198 + 1);
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 != 3);
    iVar10 = 0;
    do {
      pcVar13 = "single_statement";
      if ((iVar10 != 0) && (pcVar13 = "multiple_statements", iVar10 != 1)) {
        if (iVar10 == 2) {
          pcVar13 = "static_branch";
        }
        else {
          pcVar13 = (char *)0x0;
          if (iVar10 == 3) {
            pcVar13 = "loop";
          }
        }
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a8,pcVar13,(allocator<char> *)&local_298);
      pcVar13 = "A single statement containing multiple uses of same subexpression";
      if ((iVar10 != 0) &&
         (pcVar13 = "Multiple statements performing same computations", iVar10 != 1)) {
        if (iVar10 == 2) {
          pcVar13 = "Multiple statements including a static conditional";
        }
        else {
          pcVar13 = (char *)0x0;
          if (iVar10 == 3) {
            pcVar13 = "Multiple loops performing the same computations";
          }
        }
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_298,pcVar13,(allocator<char> *)&local_2b8);
      pSVar6 = (ShaderOptimizationCase *)operator_new(0x358);
      pCVar1 = (local_250->super_TestCaseGroup).m_context;
      local_2b8 = &local_2a8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2b8,local_1a8,(long)local_1a8 + local_1a0);
      std::__cxx11::string::append((char *)&local_2b8);
      anon_unknown_1::ShaderOptimizationCase::ShaderOptimizationCase
                (pSVar6,pCVar1,(char *)local_2b8,(char *)local_298,(CaseShaderType)local_278);
      (pSVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ShaderOptimizationCase_0219ce60;
      *(int *)&pSVar6[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = iVar10;
      tcu::TestNode::addChild(local_1c0,(TestNode *)pSVar6);
      if (local_2b8 != &local_2a8) {
        operator_delete(local_2b8,local_2a8 + 1);
      }
      if (local_298 != &local_288) {
        operator_delete(local_298,local_288 + 1);
      }
      if (local_1a8 != &local_198) {
        operator_delete(local_1a8,local_198 + 1);
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 != 4);
    lVar11 = 0;
    pSVar12 = local_250;
    do {
      uVar2 = (uint)lVar11;
      local_1b8 = 
      "Do computation inside a branch that is never taken (condition is simple false constant expression)"
      ;
      if (uVar2 != 0) {
        if (uVar2 < 8) {
          local_1b8 = (char *)((long)&DAT_01c679e4 + (long)(int)(&DAT_01c679e0)[lVar11]);
        }
        else {
          local_1b8 = (char *)0x0;
          if (uVar2 == 8) {
            local_1b8 = "Compute a value that is used but multiplied by a zero constant expression";
          }
        }
      }
      pSVar6 = (ShaderOptimizationCase *)operator_new(0x358);
      pCVar1 = (pSVar12->super_TestCaseGroup).m_context;
      local_2b8 = &local_2a8;
      local_2b0 = 0;
      local_2a8 = local_2a8 & 0xffffffffffffff00;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_2b8);
      local_298 = &local_288;
      plVar7 = plVar5 + 2;
      if ((long *)*plVar5 == plVar7) {
        local_288 = *plVar7;
        lStack_280 = plVar5[3];
      }
      else {
        local_288 = *plVar7;
        local_298 = (long *)*plVar5;
      }
      local_290 = plVar5[1];
      *plVar5 = (long)plVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_298);
      local_1a8 = &local_198;
      plVar7 = plVar5 + 2;
      if ((long *)*plVar5 == plVar7) {
        local_198 = *plVar7;
        lStack_190 = plVar5[3];
      }
      else {
        local_198 = *plVar7;
        local_1a8 = (long *)*plVar5;
      }
      local_1a0 = plVar5[1];
      *plVar5 = (long)plVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      anon_unknown_1::ShaderOptimizationCase::ShaderOptimizationCase
                (pSVar6,pCVar1,(char *)local_1a8,local_1b8,(CaseShaderType)local_278);
      (pSVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ShaderOptimizationCase_0219ceb8;
      *(uint *)&pSVar6[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = uVar2;
      tcu::TestNode::addChild(local_1c8,(TestNode *)pSVar6);
      if (local_1a8 != &local_198) {
        operator_delete(local_1a8,local_198 + 1);
      }
      pSVar12 = local_250;
      if (local_298 != &local_288) {
        operator_delete(local_298,local_288 + 1);
      }
      if (local_2b8 != &local_2a8) {
        operator_delete(local_2b8,local_2a8 + 1);
      }
      lVar11 = lVar11 + 1;
    } while ((int)lVar11 != 9);
    iVar10 = (int)local_278;
    uVar2 = iVar10 + 1;
    local_278 = (ulong)uVar2;
    if (iVar10 != 0) {
      return uVar2;
    }
  } while( true );
}

Assistant:

void ShaderOptimizationTests::init (void)
{
	TestCaseGroup* const unrollGroup					= new TestCaseGroup(m_context, "loop_unrolling",					"Loop Unrolling Cases");
	TestCaseGroup* const loopInvariantCodeMotionGroup	= new TestCaseGroup(m_context, "loop_invariant_code_motion",		"Loop-Invariant Code Motion Cases");
	TestCaseGroup* const inlineGroup					= new TestCaseGroup(m_context, "function_inlining",					"Function Inlining Cases");
	TestCaseGroup* const constantPropagationGroup		= new TestCaseGroup(m_context, "constant_propagation",				"Constant Propagation Cases");
	TestCaseGroup* const commonSubexpressionGroup		= new TestCaseGroup(m_context, "common_subexpression_elimination",	"Common Subexpression Elimination Cases");
	TestCaseGroup* const deadCodeEliminationGroup		= new TestCaseGroup(m_context, "dead_code_elimination",				"Dead Code Elimination Cases");
	addChild(unrollGroup);
	addChild(loopInvariantCodeMotionGroup);
	addChild(inlineGroup);
	addChild(constantPropagationGroup);
	addChild(commonSubexpressionGroup);
	addChild(deadCodeEliminationGroup);

	for (int caseShaderTypeI = 0; caseShaderTypeI < CASESHADERTYPE_LAST; caseShaderTypeI++)
	{
		const CaseShaderType	caseShaderType			= (CaseShaderType)caseShaderTypeI;
		const char* const		caseShaderTypeSuffix	= caseShaderType == CASESHADERTYPE_VERTEX		? "_vertex"
														: caseShaderType == CASESHADERTYPE_FRAGMENT		? "_fragment"
														: DE_NULL;

		// Loop unrolling cases.

		{
			static const int loopIterationCounts[] = { 4, 8, 32 };

			for (int caseTypeI = 0; caseTypeI < LoopUnrollCase::CASETYPE_LAST; caseTypeI++)
			{
				const LoopUnrollCase::CaseType	caseType		= (LoopUnrollCase::CaseType)caseTypeI;
				const string					caseTypeName	= caseType == LoopUnrollCase::CASETYPE_INDEPENDENT	? "independent_iterations"
																: caseType == LoopUnrollCase::CASETYPE_DEPENDENT	? "dependent_iterations"
																: DE_NULL;
				const string					caseTypeDesc	= caseType == LoopUnrollCase::CASETYPE_INDEPENDENT	? "loop iterations don't depend on each other"
																: caseType == LoopUnrollCase::CASETYPE_DEPENDENT	? "loop iterations depend on each other"
																: DE_NULL;

				for (int loopIterNdx = 0; loopIterNdx < DE_LENGTH_OF_ARRAY(loopIterationCounts); loopIterNdx++)
				{
					const int			loopIterations	= loopIterationCounts[loopIterNdx];
					const string		name			= caseTypeName + "_" + toString(loopIterations) + caseShaderTypeSuffix;
					const string		description		= toString(loopIterations) + " iterations; " + caseTypeDesc;

					unrollGroup->addChild(new LoopUnrollCase(m_context, name.c_str(), description.c_str(), caseShaderType, caseType, loopIterations));
				}
			}
		}

		// Loop-invariant code motion cases.

		{
			static const int loopIterationCounts[] = { 4, 8, 32 };

			for (int loopIterNdx = 0; loopIterNdx < DE_LENGTH_OF_ARRAY(loopIterationCounts); loopIterNdx++)
			{
				const int		loopIterations	= loopIterationCounts[loopIterNdx];
				const string	name			= toString(loopIterations) + "_iterations" + caseShaderTypeSuffix;

				loopInvariantCodeMotionGroup->addChild(new LoopInvariantCodeMotionCase(m_context, name.c_str(), "", caseShaderType, loopIterations));
			}
		}

		// Function inlining cases.

		{
			static const int callNestingDepths[] = { 4, 8, 32 };

			for (int nestDepthNdx = 0; nestDepthNdx < DE_LENGTH_OF_ARRAY(callNestingDepths); nestDepthNdx++)
			{
				const int		nestingDepth	= callNestingDepths[nestDepthNdx];
				const string	name			= toString(nestingDepth) + "_nested" + caseShaderTypeSuffix;

				inlineGroup->addChild(new FunctionInliningCase(m_context, name.c_str(), "", caseShaderType, nestingDepth));
			}
		}

		// Constant propagation cases.

		for (int caseTypeI = 0; caseTypeI < ConstantPropagationCase::CASETYPE_LAST; caseTypeI++)
		{
			const ConstantPropagationCase::CaseType		caseType		= (ConstantPropagationCase::CaseType)caseTypeI;
			const string								caseTypeName	= caseType == ConstantPropagationCase::CASETYPE_BUILT_IN_FUNCTIONS		? "built_in_functions"
																		: caseType == ConstantPropagationCase::CASETYPE_ARRAY					? "array"
																		: caseType == ConstantPropagationCase::CASETYPE_STRUCT					? "struct"
																		: DE_NULL;

			for (int constantExpressionsOnlyI = 0; constantExpressionsOnlyI <= 1; constantExpressionsOnlyI++)
			{
				const bool		constantExpressionsOnly		= constantExpressionsOnlyI != 0;
				const string	name						= caseTypeName + (constantExpressionsOnly ? "" : "_no_const") + caseShaderTypeSuffix;

				constantPropagationGroup->addChild(new ConstantPropagationCase(m_context, name.c_str(), "", caseShaderType, caseType, constantExpressionsOnly));
			}
		}

		// Common subexpression cases.

		for (int caseTypeI = 0; caseTypeI < CommonSubexpressionCase::CASETYPE_LAST; caseTypeI++)
		{
			const CommonSubexpressionCase::CaseType		caseType		= (CommonSubexpressionCase::CaseType)caseTypeI;

			const string								caseTypeName	= caseType == CommonSubexpressionCase::CASETYPE_SINGLE_STATEMENT		? "single_statement"
																		: caseType == CommonSubexpressionCase::CASETYPE_MULTIPLE_STATEMENTS		? "multiple_statements"
																		: caseType == CommonSubexpressionCase::CASETYPE_STATIC_BRANCH			? "static_branch"
																		: caseType == CommonSubexpressionCase::CASETYPE_LOOP					? "loop"
																		: DE_NULL;

			const string								description		= caseType == CommonSubexpressionCase::CASETYPE_SINGLE_STATEMENT		? "A single statement containing multiple uses of same subexpression"
																		: caseType == CommonSubexpressionCase::CASETYPE_MULTIPLE_STATEMENTS		? "Multiple statements performing same computations"
																		: caseType == CommonSubexpressionCase::CASETYPE_STATIC_BRANCH			? "Multiple statements including a static conditional"
																		: caseType == CommonSubexpressionCase::CASETYPE_LOOP					? "Multiple loops performing the same computations"
																		: DE_NULL;

			commonSubexpressionGroup->addChild(new CommonSubexpressionCase(m_context, (caseTypeName + caseShaderTypeSuffix).c_str(), description.c_str(), caseShaderType, caseType));
		}

		// Dead code elimination cases.

		for (int caseTypeI = 0; caseTypeI < DeadCodeEliminationCase::CASETYPE_LAST; caseTypeI++)
		{
			const DeadCodeEliminationCase::CaseType		caseType				= (DeadCodeEliminationCase::CaseType)caseTypeI;
			const char* const							caseTypeName			= caseType == DeadCodeEliminationCase::CASETYPE_DEAD_BRANCH_SIMPLE				? "dead_branch_simple"
																				: caseType == DeadCodeEliminationCase::CASETYPE_DEAD_BRANCH_COMPLEX				? "dead_branch_complex"
																				: caseType == DeadCodeEliminationCase::CASETYPE_DEAD_BRANCH_COMPLEX_NO_CONST	? "dead_branch_complex_no_const"
																				: caseType == DeadCodeEliminationCase::CASETYPE_DEAD_BRANCH_FUNC_CALL			? "dead_branch_func_call"
																				: caseType == DeadCodeEliminationCase::CASETYPE_UNUSED_VALUE_BASIC				? "unused_value_basic"
																				: caseType == DeadCodeEliminationCase::CASETYPE_UNUSED_VALUE_LOOP				? "unused_value_loop"
																				: caseType == DeadCodeEliminationCase::CASETYPE_UNUSED_VALUE_DEAD_BRANCH		? "unused_value_dead_branch"
																				: caseType == DeadCodeEliminationCase::CASETYPE_UNUSED_VALUE_AFTER_RETURN		? "unused_value_after_return"
																				: caseType == DeadCodeEliminationCase::CASETYPE_UNUSED_VALUE_MUL_ZERO			? "unused_value_mul_zero"
																				: DE_NULL;

			const char* const							caseTypeDescription		= caseType == DeadCodeEliminationCase::CASETYPE_DEAD_BRANCH_SIMPLE				? "Do computation inside a branch that is never taken (condition is simple false constant expression)"
																				: caseType == DeadCodeEliminationCase::CASETYPE_DEAD_BRANCH_COMPLEX				? "Do computation inside a branch that is never taken (condition is complex false constant expression)"
																				: caseType == DeadCodeEliminationCase::CASETYPE_DEAD_BRANCH_COMPLEX_NO_CONST	? "Do computation inside a branch that is never taken (condition is complex false expression, not constant expression but still compile-time computable)"
																				: caseType == DeadCodeEliminationCase::CASETYPE_DEAD_BRANCH_FUNC_CALL			? "Do computation inside a branch that is never taken (condition is compile-time computable false expression containing function call to a simple inlineable function)"
																				: caseType == DeadCodeEliminationCase::CASETYPE_UNUSED_VALUE_BASIC				? "Compute a value that is never used even statically"
																				: caseType == DeadCodeEliminationCase::CASETYPE_UNUSED_VALUE_LOOP				? "Compute a value, using a loop, that is never used even statically"
																				: caseType == DeadCodeEliminationCase::CASETYPE_UNUSED_VALUE_DEAD_BRANCH		? "Compute a value that is used only inside a statically dead branch"
																				: caseType == DeadCodeEliminationCase::CASETYPE_UNUSED_VALUE_AFTER_RETURN		? "Compute a value that is used only after a return statement"
																				: caseType == DeadCodeEliminationCase::CASETYPE_UNUSED_VALUE_MUL_ZERO			? "Compute a value that is used but multiplied by a zero constant expression"
																				: DE_NULL;

			deadCodeEliminationGroup->addChild(new DeadCodeEliminationCase(m_context, (string() + caseTypeName + caseShaderTypeSuffix).c_str(), caseTypeDescription, caseShaderType, caseType));
		}
	}
}